

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-dice.c
# Opt level: O3

_Bool dice_parse_string(dice_t *dice,char *string)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  char cVar4;
  uint uVar5;
  wchar_t wVar6;
  _Bool _Var11;
  byte *pbVar7;
  dice_expression_entry_t *pdVar8;
  char *pcVar9;
  size_t sVar10;
  long lVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  char token [17];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48;
  char *local_40;
  ushort **local_38;
  
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uVar5 = 0;
  if (string != (char *)0x0 && dice != (dice_t *)0x0) {
    dice_reset(dice);
    local_38 = __ctype_b_loc();
    uVar17 = 0;
    uVar14 = 0;
    uVar16 = 0;
    local_40 = string;
    do {
      bVar1 = string[uVar14];
      uVar3 = (*local_38)[(char)bVar1];
      if ((uVar3 >> 0xd & 1) != 0) goto switchD_001f629b_caseD_3;
      if (0x4c < bVar1) {
        if (bVar1 != 0x4d) {
          if (bVar1 == 100) {
            lVar12 = 3;
            goto LAB_001f61d9;
          }
          if (bVar1 != 0x6d) goto switchD_001f6153_caseD_25;
        }
        goto LAB_001f6205;
      }
      switch(bVar1) {
      case 0x24:
        lVar12 = 5;
        break;
      case 0x25:
      case 0x27:
      case 0x28:
      case 0x29:
      case 0x2a:
      case 0x2c:
switchD_001f6153_caseD_25:
        lVar12 = 6;
        if (((uVar3 >> 0xb & 1) == 0) && (lVar12 = 7, (uVar3 >> 8 & 1) == 0)) goto LAB_001f6205;
        goto LAB_001f619d;
      case 0x26:
        lVar12 = 0;
        break;
      case 0x2b:
        lVar12 = 2;
        break;
      case 0x2d:
        lVar12 = 1;
LAB_001f619d:
        if (uVar16 < 0x10) {
          *(byte *)((long)&local_58 + uVar16) = bVar1;
          uVar16 = uVar16 + 1;
        }
        if ((int)uVar17 != 0xd) {
          bVar2 = ".B.EHKB....CE..B.C...EHKD.....E..D.......KF..G...H.F.G....H.........KI........I.J................L.G.CEH..LM........."
                  [lVar12 + uVar17 * 9];
          goto LAB_001f61f5;
        }
        goto LAB_001f61ff;
      default:
        if (bVar1 != 0) goto switchD_001f6153_caseD_25;
        lVar12 = 8;
      }
LAB_001f61d9:
      if ((int)uVar17 == 0xd) {
LAB_001f61ff:
        uVar17 = 0xd;
      }
      else {
        bVar2 = ".B.EHKB....CE..B.C...EHKD.....E..D.......KF..G...H.F.G....H.........KI........I.J................L.G.CEH..LM........."
                [lVar12 + uVar17 * 9];
LAB_001f61f5:
        if (bVar2 == 0x2e) goto LAB_001f61ff;
        uVar17 = (ulong)(bVar2 - 0x41);
      }
LAB_001f6205:
      if (bVar1 == 0x6d) {
LAB_001f6240:
        if (((uint)uVar17 != 0xd) && ((0x179aUL >> (uVar17 & 0x3f) & 1) == 0)) {
          pbVar7 = (byte *)(
                           ".B.EHKB....CE..B.C...EHKD.....E..D.......KF..G...H.F.G....H.........KI........I.J................L.G.CEH..LM........."
                           + uVar17 * 9 + 4);
LAB_001f626e:
          uVar17 = (ulong)(*pbVar7 - 0x41);
          goto LAB_001f6276;
        }
LAB_001f6423:
        uVar5 = 0;
        goto LAB_001f6425;
      }
      if (bVar1 == 0x4d) {
        if (((uint)uVar17 & 0xfffffffe) != 10) goto LAB_001f6240;
        if (uVar16 < 0x10) {
          *(undefined1 *)((long)&local_58 + uVar16) = 0x4d;
          uVar16 = uVar16 + 1;
        }
        pbVar7 = (byte *)(
                         ".B.EHKB....CE..B.C...EHKD.....E..D.......KF..G...H.F.G....H.........KI........I.J................L.G.CEH..LM........."
                         + uVar17 * 9 + 7);
        goto LAB_001f626e;
      }
LAB_001f6276:
      if (0xc < (uint)uVar17) goto LAB_001f6423;
      cVar4 = (char)local_58;
      switch((uint)uVar17) {
      case 2:
        uVar5 = 1;
        break;
      default:
        goto switchD_001f629b_caseD_3;
      case 4:
        uVar5 = 2;
        if ((char)local_58 == '\0') {
          local_58 = CONCAT62(local_58._2_6_,0x31);
          cVar4 = '1';
        }
        goto LAB_001f62f3;
      case 6:
        uVar5 = 3;
        break;
      case 7:
        uVar5 = (uVar5 != 2) + 3;
        break;
      case 9:
        uVar5 = 4;
        break;
      case 0xc:
        bVar18 = 3 < uVar5;
        uVar5 = uVar5 + 1;
        if (bVar18) {
          uVar5 = 4;
        }
      }
      if ((char)local_58 != '\0') {
LAB_001f62f3:
        uVar3 = (*local_38)[cVar4];
        if ((uVar3 & 0x100) == 0) {
          lVar12 = strtol((char *)&local_58,(char **)0x0,0);
LAB_001f63ac:
          iVar15 = (int)lVar12;
        }
        else {
          if (dice->expressions == (dice_expression_entry_t *)0x0) {
            pdVar8 = (dice_expression_entry_t *)mem_zalloc(0x40);
            dice->expressions = pdVar8;
          }
          lVar13 = 0;
          lVar12 = 0;
          do {
            pcVar9 = *(char **)((long)&dice->expressions->name + lVar13);
            if (pcVar9 == (char *)0x0) {
              pcVar9 = string_make((char *)&local_58);
              *(char **)((long)&dice->expressions->name + lVar13) = pcVar9;
              goto LAB_001f63a0;
            }
            wVar6 = my_stricmp(pcVar9,(char *)&local_58);
            string = local_40;
            if (wVar6 == L'\0') goto LAB_001f63ac;
            lVar12 = lVar12 + 1;
            lVar13 = lVar13 + 0x10;
          } while (lVar12 != 4);
          lVar12 = 0xffffffff;
LAB_001f63a0:
          iVar15 = (int)lVar12;
          string = local_40;
        }
        _Var11 = SUB21((uVar3 & 0x100) >> 8,0);
        switch(uVar5) {
        case 1:
          dice->b = iVar15;
          dice->ex_b = _Var11;
          break;
        case 2:
          dice->x = iVar15;
          dice->ex_x = _Var11;
          break;
        case 3:
          dice->y = iVar15;
          dice->ex_y = _Var11;
          break;
        case 4:
          dice->m = iVar15;
          dice->ex_m = _Var11;
        }
        local_58 = 0;
        uStack_50 = 0;
        local_48 = 0;
        uVar16 = 0;
      }
switchD_001f629b_caseD_3:
      uVar14 = uVar14 + 1;
      sVar10 = strlen(string);
    } while (uVar14 <= sVar10);
    uVar5 = 1;
  }
LAB_001f6425:
  return SUB41(uVar5,0);
}

Assistant:

bool dice_parse_string(dice_t *dice, const char *string)
{
	char token[DICE_TOKEN_SIZE + 1] = { '\0' };
	size_t token_end = 0;
	size_t current = 0;
	dice_state_t state = 0;

	/* We need to keep track of the last thing we saw, since the parser isn't complex. */
	enum last_seen_e {
		DICE_SEEN_NONE,
		DICE_SEEN_BASE,
		DICE_SEEN_DICE,
		DICE_SEEN_SIDE,
		DICE_SEEN_BONUS,
	} last_seen = DICE_SEEN_NONE;

	if (dice == NULL || string == NULL)
		return false;

	/* Reset all internal state, since this object might be reused. */
	dice_reset(dice);

	/* Note that we are including the string terminator as part of the parse. */
	for (current = 0; current <= strlen(string); current++) {
		bool flush;
		dice_input_t input_type = DICE_INPUT_MAX;

		/* Skip spaces; this will concatenate digits and variable names. */
		if (isspace(string[current]))
			continue;

		input_type = dice_input_for_char(string[current]);

		/*
		 * Get the next state, based on the type of input char. If it's a
		 * possible number or varible name, we'll store the character in the
		 * token buffer.
		 */
		switch (input_type) {
			case DICE_INPUT_AMP:
			case DICE_INPUT_BASE:
			case DICE_INPUT_DICE:
			case DICE_INPUT_VAR:
			case DICE_INPUT_NULL:
				state = dice_parse_state_transition(state, input_type);
				break;

			case DICE_INPUT_MINUS:
			case DICE_INPUT_DIGIT:
			case DICE_INPUT_UPPER:
				/* Truncate tokens if they are too long to fit. */
				if (token_end < DICE_TOKEN_SIZE) {
					token[token_end] = string[current];
					token_end++;
				}

				state = dice_parse_state_transition(state, input_type);
				break;

			default:
				break;
		}

		/*
		 * Allow 'M' to be used as the bonus marker and to be used in variable
		 * names.
		 * Ideally, 'm' should be the only marker and this could go away by
		 * adding a case to the switch above for DICE_INPUT_BONUS
		 * (underneath DICE_INPUT_NULL).
		 */
		if (string[current] == 'M') {
			if (state == DICE_STATE_VAR || state == DICE_STATE_VAR_CHAR) {
				if (token_end < DICE_TOKEN_SIZE) {
					token[token_end] = string[current];
					token_end++;
				}

				state = dice_parse_state_transition(state, DICE_INPUT_UPPER);
			}
			else
				state = dice_parse_state_transition(state, DICE_INPUT_BONUS);
		}
		else if (string[current] == 'm') {
			state = dice_parse_state_transition(state, DICE_INPUT_BONUS);
		}

		/* Illegal transition. */
		if (state >= DICE_STATE_MAX)
			return false;

		/*
		 * Default flushing to true, since there are more states that don't
		 * need to be flushed. For some states, we need to do a bit of extra
		 * work, since the parser isn't that complex. A more complex parser
		 * would have more explicit states for variable names.
		 */
		flush = true;

		switch (state) {
			case DICE_STATE_FLUSH_BASE:
				last_seen = DICE_SEEN_BASE;
				break;

			case DICE_STATE_FLUSH_DICE:
				last_seen = DICE_SEEN_DICE;
				/* If we see a 'd' without a number before it, we assume it
				 * to be one die. */
				if (strlen(token) == 0) {
					token[0] = '1';
					token[1] = '\0';
				}
				break;

			case DICE_STATE_FLUSH_SIDE:
				last_seen = DICE_SEEN_SIDE;
				break;

			case DICE_STATE_FLUSH_BONUS:
				last_seen = DICE_SEEN_BONUS;
				break;

			case DICE_STATE_FLUSH_ALL:
				/* Flushing all means that we are flushing whatever comes after
				 * it was that we last saw. */
				if (last_seen < DICE_SEEN_BONUS)
					last_seen++;
				break;

			case DICE_STATE_BONUS:
				/* The bonus state is weird, so if we last saw dice, we're now
				 * seeing sides. */
				if (last_seen == DICE_SEEN_DICE)
					last_seen = DICE_SEEN_SIDE;
				else
					last_seen = DICE_SEEN_BONUS;
				break;

			default:
				/* We're in a state that shouldn't flush anything. */
				flush = false;
				break;
		}

		/*
		 * If we have a token that we need to flush, put it where it needs to
		 * go in the dice object. If the token is an uppercase letter, it's
		 * a variable and needs to go in the expression table. Otherwise, we
		 * try to parse it as a number, where it is set directly as a value.
		 */
		if (flush && strlen(token) > 0) {
			int value = 0;
			bool is_variable = false;

			if (isupper(token[0])) {
				value = dice_add_variable(dice, token);
				is_variable = true;
			}
			else {
				value = (int)strtol(token, NULL, 0);
				is_variable = false;
			}

			switch (last_seen) {
				case DICE_SEEN_BASE:
					dice->b = value;
					dice->ex_b = is_variable;
					break;
				case DICE_SEEN_DICE:
					dice->x = value;
					dice->ex_x = is_variable;
					break;
				case DICE_SEEN_SIDE:
					dice->y = value;
					dice->ex_y = is_variable;
					break;
				case DICE_SEEN_BONUS:
					dice->m = value;
					dice->ex_m = is_variable;
					break;
				default:
					break;
			}

			memset(token, 0, DICE_TOKEN_SIZE + 1);
			token_end = 0;
		}
	}

	return true;
}